

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void evaluate(char **argv)

{
  ulong uVar1;
  Model model;
  CCELossNode *loss;
  MNIST *mnist;
  ifstream params_file;
  ifstream labels;
  ifstream images;
  Model local_698;
  CCELossNode *local_660;
  MNIST *local_658;
  path local_650;
  path local_628 [13];
  path local_420 [13];
  ifstream local_218 [520];
  
  puts("Executing evaluation routine");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (local_628,argv,auto_format);
  std::filesystem::__cxx11::path::path<char[23],std::filesystem::__cxx11::path>
            ((path *)&local_698,(char (*) [23])"t10k-images-idx3-ubyte",auto_format);
  std::filesystem::__cxx11::operator/(local_420,local_628,(path *)&local_698);
  std::ifstream::ifstream(local_218,local_420[0]._M_pathname._M_dataplus._M_p,_S_bin);
  std::filesystem::__cxx11::path::~path(local_420);
  std::filesystem::__cxx11::path::~path((path *)&local_698);
  std::filesystem::__cxx11::path::~path(local_628);
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&local_698,argv,auto_format);
  std::filesystem::__cxx11::path::path<char[23],std::filesystem::__cxx11::path>
            (&local_650,(char (*) [23])"t10k-labels-idx1-ubyte",auto_format);
  std::filesystem::__cxx11::operator/(local_628,(path *)&local_698,&local_650);
  std::ifstream::ifstream(local_420,local_628[0]._M_pathname._M_dataplus._M_p,_S_bin);
  std::filesystem::__cxx11::path::~path(local_628);
  std::filesystem::__cxx11::path::~path(&local_650);
  std::filesystem::__cxx11::path::~path((path *)&local_698);
  create_model(&local_698,local_218,(ifstream *)local_420,&local_658,&local_660);
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_650,argv + 1,auto_format);
  std::ifstream::ifstream(local_628,local_650._M_pathname._M_dataplus._M_p,_S_bin);
  std::filesystem::__cxx11::path::~path(&local_650);
  Model::load(&local_698,(ifstream *)local_628);
  if (local_658->image_count_ != 0) {
    uVar1 = 0;
    do {
      (*(local_658->super_Node)._vptr_Node[3])(local_658,0);
      uVar1 = uVar1 + 1;
    } while (uVar1 != local_658->image_count_);
  }
  (*(local_660->super_Node)._vptr_Node[8])();
  std::ifstream::~ifstream(local_628);
  std::
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ::~vector(&local_698.nodes_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698.name_._M_dataplus._M_p != &local_698.name_.field_2) {
    operator_delete(local_698.name_._M_dataplus._M_p,
                    local_698.name_.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_420);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void evaluate(char* argv[])
{
    std::printf("Executing evaluation routine\n");

    std::ifstream images{
        std::filesystem::path{argv[0]} / "t10k-images-idx3-ubyte",
        std::ios::binary};

    std::ifstream labels{
        std::filesystem::path{argv[0]} / "t10k-labels-idx1-ubyte",
        std::ios::binary};

    MNIST* mnist;
    CCELossNode* loss;
    // For the data to be loaded properly, the model must be constructed in the
    // same manner as it was constructed during training.
    Model model = create_model(images, labels, &mnist, &loss);

    // Instead of initializing the parameters randomly, here we load it from
    // disk (saved from a previous training run).
    std::ifstream params_file{std::filesystem::path{argv[1]}, std::ios::binary};
    model.load(params_file);

    // Evaluate all 10000 images in the test set and compute the loss average
    for (size_t i = 0; i != mnist->size(); ++i)
    {
        mnist->forward();
    }
    loss->print();
}